

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O0

ChVector<double> *
chrono::ChTransform<double>::TransformParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChVector<double> *parent,
          ChVector<double> *origin,ChQuaternion<double> *alignment)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double *pdVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dz;
  double dy;
  double dx;
  double e2e3;
  double e1e3;
  double e1e2;
  double e0e3;
  double e0e2;
  double e0e1;
  double e3e3;
  double e2e2;
  double e1e1;
  double e0e0;
  ChQuaternion<double> *alignment_local;
  ChVector<double> *origin_local;
  ChVector<double> *parent_local;
  
  pdVar23 = ChQuaternion<double>::e0(alignment);
  dVar1 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e0(alignment);
  dVar1 = dVar1 * *pdVar23;
  pdVar23 = ChQuaternion<double>::e1(alignment);
  dVar2 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e1(alignment);
  dVar3 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e2(alignment);
  dVar4 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e2(alignment);
  dVar5 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e3(alignment);
  dVar6 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e3(alignment);
  dVar7 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e0(alignment);
  dVar8 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e1(alignment);
  dVar9 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e0(alignment);
  dVar10 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e2(alignment);
  dVar11 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e0(alignment);
  dVar12 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e3(alignment);
  dVar13 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e1(alignment);
  dVar14 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e2(alignment);
  dVar15 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e1(alignment);
  dVar16 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e3(alignment);
  dVar17 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e2(alignment);
  dVar18 = *pdVar23;
  pdVar23 = ChQuaternion<double>::e3(alignment);
  dVar19 = *pdVar23;
  pdVar23 = ChVector<double>::x(parent);
  dVar20 = *pdVar23;
  pdVar23 = ChVector<double>::x(origin);
  dVar20 = dVar20 - *pdVar23;
  pdVar23 = ChVector<double>::y(parent);
  dVar21 = *pdVar23;
  pdVar23 = ChVector<double>::y(origin);
  dVar21 = dVar21 - *pdVar23;
  pdVar23 = ChVector<double>::z(parent);
  dVar22 = *pdVar23;
  pdVar23 = ChVector<double>::z(origin);
  dVar22 = dVar22 - *pdVar23;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 + dVar2 * dVar3;
  auVar25 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar25,ZEXT816(0xbff0000000000000));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (dVar14 * dVar15 - -dVar12 * dVar13) * 2.0 * dVar21;
  auVar25 = vfmadd213sd_fma(auVar30,auVar25,auVar26);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar22;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (dVar16 * dVar17 + -dVar10 * dVar11) * 2.0;
  auVar25 = vfmadd213sd_fma(auVar24,auVar27,auVar25);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar20;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1 + dVar4 * dVar5;
  auVar24 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar38,ZEXT816(0xbff0000000000000));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (dVar14 * dVar15 + -dVar12 * dVar13) * 2.0;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar24._0_8_ * dVar21;
  auVar24 = vfmadd213sd_fma(auVar36,auVar28,auVar31);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar22;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (dVar18 * dVar19 - -dVar8 * dVar9) * 2.0;
  auVar24 = vfmadd213sd_fma(auVar29,auVar32,auVar24);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar20;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (dVar16 * dVar17 - -dVar10 * dVar11) * 2.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (dVar18 * dVar19 + -dVar8 * dVar9) * 2.0 * dVar21;
  auVar26 = vfmadd213sd_fma(auVar39,auVar33,auVar37);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 + dVar6 * dVar7;
  auVar27 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar34,ZEXT816(0xbff0000000000000));
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar22;
  auVar26 = vfmadd213sd_fma(auVar35,auVar27,auVar26);
  ChVector<double>::ChVector(__return_storage_ptr__,auVar25._0_8_,auVar24._0_8_,auVar26._0_8_);
  return __return_storage_ptr__;
}

Assistant:

static ChVector<Real> TransformParentToLocal(
        const ChVector<Real>& parent,        ///< point to transform, given in parent coordinates
        const ChVector<Real>& origin,        ///< origin of frame respect to parent, in parent coords,
        const ChQuaternion<Real>& alignment  ///< rotation of frame respect to parent, in parent coords.
        ) {
        // It could be simply "return alignment.RotateBack(parent-origin);"
        // but for faster execution do this:
        Real e0e0 = alignment.e0() * alignment.e0();
        Real e1e1 = alignment.e1() * alignment.e1();
        Real e2e2 = alignment.e2() * alignment.e2();
        Real e3e3 = alignment.e3() * alignment.e3();
        Real e0e1 = -alignment.e0() * alignment.e1();
        Real e0e2 = -alignment.e0() * alignment.e2();
        Real e0e3 = -alignment.e0() * alignment.e3();
        Real e1e2 = alignment.e1() * alignment.e2();
        Real e1e3 = alignment.e1() * alignment.e3();
        Real e2e3 = alignment.e2() * alignment.e3();
        Real dx = parent.x() - origin.x();
        Real dy = parent.y() - origin.y();
        Real dz = parent.z() - origin.z();
        return ChVector<Real>(((e0e0 + e1e1) * 2. - 1.) * dx + ((e1e2 - e0e3) * 2.) * dy + ((e1e3 + e0e2) * 2.) * dz,
                              ((e1e2 + e0e3) * 2.) * dx + ((e0e0 + e2e2) * 2. - 1.) * dy + ((e2e3 - e0e1) * 2.) * dz,
                              ((e1e3 - e0e2) * 2.) * dx + ((e2e3 + e0e1) * 2.) * dy + ((e0e0 + e3e3) * 2. - 1.) * dz);
    }